

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.cpp
# Opt level: O2

ssize_t __thiscall ZlibWriter::write(ZlibWriter *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  Bytef *__x;
  bool bVar4;
  uint8_t zchunk [16384];
  Bytef local_4038 [16392];
  
  this->zbuf_changed = true;
  (this->z).next_in = (Bytef *)CONCAT44(in_register_00000034,__fd);
  (this->z).avail_in = (uInt)__buf;
  do {
    (this->z).next_out = local_4038;
    (this->z).avail_out = 0x4000;
    uVar1 = deflate(&this->z,0);
    if (1 < uVar1) {
      return (ulong)((uInt)__buf - (this->z).avail_in);
    }
    iVar2 = (this->z).avail_out - 0x4000;
    if (iVar2 != 0) {
      uVar3 = (ulong)(uint)-iVar2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                (&this->zbuf,
                 (size_type)
                 ((this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish +
                 (uVar3 - (long)(this->zbuf).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start)));
      __x = local_4038;
      while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->zbuf,__x);
        __x = __x + 1;
      }
    }
  } while ((this->z).avail_in != 0);
  return (ssize_t)__buf;
}

Assistant:

int ZlibWriter::write(const void * buf, size_t size)
{
	int zresult;
	uint8_t zchunk[ZLIB_CHUNK_SIZE];

	zbuf_changed = true;

	z.next_in = (Bytef *) buf;
	z.avail_in = (uInt) size;
	do
	{
		z.next_out = zchunk;
		z.avail_out = ZLIB_CHUNK_SIZE;

		zresult = deflate(&z, Z_NO_FLUSH);
		if (zresult != Z_OK && zresult != Z_STREAM_END)
		{
			return (int) (size - z.avail_in);
		}

		size_t bytes_written = ZLIB_CHUNK_SIZE - z.avail_out;
		if (bytes_written != 0)
		{
			zbuf.reserve(zbuf.size() + bytes_written);
			for (size_t i = 0; i < bytes_written; i++)
			{
				zbuf.push_back(zchunk[i]);
			}
		}
	} while (z.avail_in != 0);

	return (int) size;
}